

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfEnvmap.cpp
# Opt level: O0

V2f Imf_3_4::LatLongMap::latLong(Box2i *dataWindow,V2f *pixelPosition)

{
  V2f VVar1;
  float *in_RDX;
  int *in_RSI;
  Vec2<float> *in_RDI;
  float extraout_XMM0_Da;
  float extraout_XMM0_Db;
  float longitude;
  float latitude;
  float local_20;
  float local_1c;
  
  if (in_RSI[1] < in_RSI[3]) {
    local_1c = ((in_RDX[1] - (float)in_RSI[1]) / (float)(in_RSI[3] - in_RSI[1]) - 0.5) * -3.1415927;
  }
  else {
    local_1c = 0.0;
  }
  if (*in_RSI < in_RSI[2]) {
    local_20 = ((*in_RDX - (float)*in_RSI) / (float)(in_RSI[2] - *in_RSI) - 0.5) * -6.2831855;
  }
  else {
    local_20 = 0.0;
  }
  Imath_3_2::Vec2<float>::Vec2(in_RDI,local_1c,local_20);
  VVar1.y = extraout_XMM0_Db;
  VVar1.x = extraout_XMM0_Da;
  return VVar1;
}

Assistant:

V2f
latLong (const Box2i& dataWindow, const V2f& pixelPosition)
{
    float latitude, longitude;

    if (dataWindow.max.y > dataWindow.min.y)
    {
        latitude = -1 * float (M_PI) *
                   ((pixelPosition.y - dataWindow.min.y) /
                        (dataWindow.max.y - dataWindow.min.y) -
                    0.5f);
    }
    else { latitude = 0; }

    if (dataWindow.max.x > dataWindow.min.x)
    {
        longitude = -2 * float (M_PI) *
                    ((pixelPosition.x - dataWindow.min.x) /
                         (dataWindow.max.x - dataWindow.min.x) -
                     0.5f);
    }
    else { longitude = 0; }

    return V2f (latitude, longitude);
}